

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# einsum.cpp
# Opt level: O2

int __thiscall ncnn::Einsum::load_param(Einsum *this,ParamDict *pd)

{
  pointer pbVar1;
  int *piVar2;
  bool bVar3;
  char *pcVar4;
  char *__s;
  size_t i;
  ulong uVar5;
  size_type sVar6;
  _Alloc_hider __haystack;
  ulong uVar7;
  int iVar8;
  size_t i_1;
  allocator<char> local_e9;
  string equation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Mat local_78;
  
  equation._M_dataplus._M_p = (pointer)0x0;
  equation._M_string_length._0_4_ = 0;
  equation._M_string_length._4_4_ = 0;
  equation.field_2._M_allocated_capacity._0_4_ = 0;
  equation.field_2._4_8_ = 0;
  ParamDict::get(&local_78,pd,0,(Mat *)&equation);
  piVar2 = (int *)CONCAT44(equation._M_string_length._4_4_,(undefined4)equation._M_string_length);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      free(equation._M_dataplus._M_p);
    }
  }
  equation._M_dataplus._M_p = (pointer)&equation.field_2;
  equation._M_string_length._0_4_ = 0;
  equation._M_string_length._4_4_ = 0;
  equation.field_2._M_allocated_capacity._0_4_ =
       equation.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  std::__cxx11::string::resize((ulong)&equation);
  __haystack._M_p = equation._M_dataplus._M_p;
  uVar5 = 0;
  uVar7 = (ulong)(uint)local_78.w;
  if (local_78.w < 1) {
    uVar7 = uVar5;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    equation._M_dataplus._M_p[uVar5] = *(char *)((long)local_78.data + uVar5 * 4);
  }
  bVar3 = std::operator==(&equation,"ii");
  if (bVar3) {
    iVar8 = 0;
    std::__cxx11::string::assign((char *)&this->rhs_token);
  }
  else {
    pcVar4 = strstr(__haystack._M_p,"->");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "invalid equation %s";
    }
    else {
      pcVar4[0] = '\0';
      pcVar4[1] = '\0';
      __s = strtok(__haystack._M_p,",");
      while (__s != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,__s,&local_e9);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->lhs_tokens,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        __s = strtok((char *)0x0,",");
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar4 + 2,&local_e9);
      std::__cxx11::string::operator=((string *)&this->rhs_token,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      __haystack._M_p = (this->rhs_token)._M_dataplus._M_p;
      sVar6 = 0;
      do {
        if ((this->rhs_token)._M_string_length == sVar6) {
          pbVar1 = (this->lhs_tokens).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = (long)(this->lhs_tokens).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
          iVar8 = 0;
          for (uVar5 = 0; uVar5 != uVar7; uVar5 = uVar5 + 1) {
            sVar6 = 0;
            while (pbVar1[uVar5]._M_string_length != sVar6) {
              pcVar4 = pbVar1[uVar5]._M_dataplus._M_p + sVar6;
              sVar6 = sVar6 + 1;
              if ((byte)(*pcVar4 + 0x87U) < 0xf0) {
                fprintf(_stderr,"invalid lhs_token %s");
                fputc(10,_stderr);
                iVar8 = -(uint)(uVar5 < uVar7);
                goto LAB_004c5069;
              }
            }
          }
          goto LAB_004c5069;
        }
        pcVar4 = __haystack._M_p + sVar6;
        sVar6 = sVar6 + 1;
      } while (0xfb < (byte)(*pcVar4 + 0x93U));
      pcVar4 = "invalid rhs_token %s";
    }
    fprintf(_stderr,pcVar4,__haystack._M_p);
    fputc(10,_stderr);
    iVar8 = -1;
  }
LAB_004c5069:
  std::__cxx11::string::~string((string *)&equation);
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar8;
}

Assistant:

int Einsum::load_param(const ParamDict& pd)
{
    Mat equation_mat = pd.get(0, Mat());

    const int equation_len = equation_mat.w;

    // restore to lexical equation string
    std::string equation;
    equation.resize(equation_len);
    char* equation_ptr = (char*)equation.c_str();
    {
        const int* p = equation_mat;
        for (int i = 0; i < equation_len; i++)
        {
            equation_ptr[i] = p[i];
        }
    }

    if (equation == "ii")
    {
        // trace
        rhs_token = "ii";

        return 0;
    }

    // split into tokens
    char* arrow = strstr(equation_ptr, "->");
    if (!arrow)
    {
        NCNN_LOGE("invalid equation %s", equation_ptr);
        return -1;
    }

    arrow[0] = '\0';
    arrow[1] = '\0';

    char* lhs = equation_ptr;
    char* rhs = arrow + 2;

    {
        char* t = strtok(lhs, ",");
        while (t)
        {
            lhs_tokens.push_back(std::string(t));
            t = strtok(NULL, ",");
        }
    }

    rhs_token = std::string(rhs);

    // check token always in ijkl
    {
        for (size_t i = 0; i < rhs_token.size(); i++)
        {
            if (rhs_token[i] < 'i' || rhs_token[i] > 'l')
            {
                NCNN_LOGE("invalid rhs_token %s", rhs_token.c_str());
                return -1;
            }
        }

        for (size_t i = 0; i < lhs_tokens.size(); i++)
        {
            const std::string& lhs_token = lhs_tokens[i];
            for (size_t j = 0; j < lhs_token.size(); j++)
            {
                if (lhs_token[j] < 'i' || lhs_token[j] > 'x')
                {
                    NCNN_LOGE("invalid lhs_token %s", lhs_token.c_str());
                    return -1;
                }
            }
        }
    }

    return 0;
}